

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::FindFile
                   (string *name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  bool bVar1;
  ulong uVar2;
  byte in_CL;
  string *in_RDI;
  string tryPath;
  string *in_stack_00001068;
  string *in_stack_ffffffffffffff88;
  allocator *paVar3;
  allocator local_51;
  undefined4 local_50;
  string local_40 [39];
  byte local_19;
  
  local_19 = in_CL & 1;
  SystemToolsStatic::FindName(name,userPaths,no_system_path);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = FileIsDirectory(in_stack_00001068);
    if (!bVar1) {
      CollapseFullPath(in_stack_ffffffffffffff88);
      goto LAB_001cdadb;
    }
  }
  paVar3 = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
LAB_001cdadb:
  local_50 = 1;
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string SystemTools::FindFile(const std::string& name,
                                  const std::vector<std::string>& userPaths,
                                  bool no_system_path)
{
  std::string tryPath =
    SystemToolsStatic::FindName(name, userPaths, no_system_path);
  if (!tryPath.empty() && !SystemTools::FileIsDirectory(tryPath)) {
    return SystemTools::CollapseFullPath(tryPath);
  }
  // Couldn't find the file.
  return "";
}